

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseStats::TestCaseStats
          (TestCaseStats *this,TestCaseInfo *_testInfo,Totals *_totals,string *_stdOut,
          string *_stdErr,bool _aborting)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  undefined4 uVar6;
  bool _aborting_local;
  string *_stdErr_local;
  string *_stdOut_local;
  Totals *_totals_local;
  TestCaseInfo *_testInfo_local;
  TestCaseStats *this_local;
  
  this->_vptr_TestCaseStats = (_func_int **)&PTR__TestCaseStats_0030bf40;
  TestCaseInfo::TestCaseInfo(&this->testInfo,_testInfo);
  (this->totals).testCases.failedButOk = (_totals->testCases).failedButOk;
  iVar5 = _totals->error;
  uVar6 = *(undefined4 *)&_totals->field_0x4;
  sVar1 = (_totals->assertions).passed;
  sVar2 = (_totals->assertions).failed;
  sVar3 = (_totals->assertions).failedButOk;
  sVar4 = (_totals->testCases).failed;
  (this->totals).testCases.passed = (_totals->testCases).passed;
  (this->totals).testCases.failed = sVar4;
  (this->totals).assertions.failed = sVar2;
  (this->totals).assertions.failedButOk = sVar3;
  (this->totals).error = iVar5;
  *(undefined4 *)&(this->totals).field_0x4 = uVar6;
  (this->totals).assertions.passed = sVar1;
  std::__cxx11::string::string((string *)&this->stdOut,(string *)_stdOut);
  std::__cxx11::string::string((string *)&this->stdErr,(string *)_stdErr);
  this->aborting = _aborting;
  return;
}

Assistant:

TestCaseStats::TestCaseStats(  TestCaseInfo const& _testInfo,
                                   Totals const& _totals,
                                   std::string const& _stdOut,
                                   std::string const& _stdErr,
                                   bool _aborting )
    : testInfo( _testInfo ),
        totals( _totals ),
        stdOut( _stdOut ),
        stdErr( _stdErr ),
        aborting( _aborting )
    {}